

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_plan_serialization.cpp
# Opt level: O3

void test_helper(string *sql,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *fixtures)

{
  pointer pbVar1;
  idx_t iVar2;
  ParserOptions PVar3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  pointer pSVar5;
  type pCVar6;
  type pBVar7;
  pointer pLVar8;
  pointer this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fixture;
  pointer pbVar9;
  pointer pcVar10;
  DuckDB db;
  string statement_sql;
  Connection con;
  Parser p;
  Optimizer optimizer;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2b8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2a0;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_298;
  long *local_290;
  long *local_288;
  code *local_280;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  DuckDB local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  Connection local_228 [32];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_208 [2];
  Optimizer local_1d8 [16];
  code *local_1c8;
  vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  local_1c0 [40];
  void *local_198;
  long *local_180;
  LogicalOperator *local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_158;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140 [56];
  shared_ptr<duckdb::Binder,_true> local_108 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8 [80];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  duckdb::DuckDB::DuckDB(local_258,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_228,local_258);
  pbVar9 = (fixtures->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (fixtures->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar1) {
    do {
      duckdb::Connection::SendQuery((string *)&local_288);
      if (local_288 != (long *)0x0) {
        (**(code **)(*local_288 + 8))();
      }
      local_288 = (long *)0x0;
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  local_270 = 1;
  uStack_268 = 1000;
  local_260 = 0;
  PVar3.max_expression_depth = 1000;
  PVar3.preserve_identifier_case = true;
  PVar3.integer_division = false;
  PVar3._2_6_ = 0;
  PVar3.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  duckdb::Parser::Parser((Parser *)local_208,PVar3);
  duckdb::Parser::ParseQuery((string *)local_208);
  local_278 = local_208[0].
              super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_208[0].
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_208[0].
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_280 = duckdb::Appender::AddColumn;
    this = local_208[0].
           super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                ((shared_ptr<duckdb::ClientContext,_true> *)local_228);
      duckdb::TransactionContext::BeginTransaction();
      pSVar5 = duckdb::
               unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(this);
      pcVar10 = (pSVar5->query)._M_dataplus._M_p;
      pSVar5 = duckdb::
               unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(this);
      iVar2 = pSVar5->stmt_location;
      pSVar5 = duckdb::
               unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(this);
      pcVar10 = pcVar10 + iVar2;
      local_248[0] = local_238;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,pcVar10,pcVar10 + pSVar5->stmt_length);
      pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)local_228);
      duckdb::Planner::Planner((Planner *)&local_178,pCVar6);
      local_298._M_head_impl =
           (this->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>
           .super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
      (this->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
      _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
      super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
      duckdb::Planner::CreatePlan((Planner *)&local_178,&local_298);
      if (local_298._M_head_impl != (SQLStatement *)0x0) {
        (*(local_298._M_head_impl)->_vptr_SQLStatement[1])();
      }
      local_298._M_head_impl = (SQLStatement *)0x0;
      local_2b0._M_head_impl = local_178;
      local_178 = (LogicalOperator *)0x0;
      pBVar7 = duckdb::shared_ptr<duckdb::Binder,_true>::operator*(local_108);
      pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)local_228);
      duckdb::Optimizer::Optimizer(local_1d8,pBVar7,pCVar6);
      local_2a0._M_head_impl = local_2b0._M_head_impl;
      local_2b0._M_head_impl = (LogicalOperator *)0x0;
      duckdb::Optimizer::Optimize(&local_2b8,local_1d8,&local_2a0);
      _Var4._M_head_impl = local_2b0._M_head_impl;
      local_2b0._M_head_impl = local_2b8._M_head_impl;
      local_2b8._M_head_impl = (LogicalOperator *)0x0;
      if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)_Var4._M_head_impl + 8))();
        if (local_2b8._M_head_impl != (LogicalOperator *)0x0) {
          (**(code **)(*(long *)local_2b8._M_head_impl + 8))();
        }
      }
      local_2b8._M_head_impl = (LogicalOperator *)0x0;
      if (local_2a0._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_2a0._M_head_impl + 8))();
      }
      local_2a0._M_head_impl = (LogicalOperator *)0x0;
      pLVar8 = duckdb::
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_2b0);
      pCVar6 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)local_228);
      (**(code **)(*(long *)pLVar8 + 0x48))(&local_2b8,pLVar8,pCVar6);
      local_2a8._M_head_impl = local_2b8._M_head_impl;
      local_2b8._M_head_impl = (LogicalOperator *)0x0;
      duckdb::Optimizer::Optimize(&local_290,local_1d8,&local_2a8);
      if (local_2a8._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_2a8._M_head_impl + 8))();
      }
      local_2a8._M_head_impl = (LogicalOperator *)0x0;
      duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                ((shared_ptr<duckdb::ClientContext,_true> *)local_228);
      duckdb::TransactionContext::Commit();
      if (local_290 != (long *)0x0) {
        (**(code **)(*local_290 + 8))();
      }
      if (local_2b8._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_2b8._M_head_impl + 8))();
      }
      if (local_180 != (long *)0x0) {
        (**(code **)(*local_180 + 8))();
      }
      local_180 = (long *)0x0;
      local_1c8 = local_280;
      if (local_198 != (void *)0x0) {
        operator_delete(local_198);
      }
      std::
      vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
      ::~vector(local_1c0);
      if (local_2b0._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_2b0._M_head_impl + 8))();
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_b8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_f0);
      if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_140);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_158);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      if (local_178 != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_178 + 8))();
      }
      if (local_248[0] != local_238) {
        operator_delete(local_248[0]);
      }
      this = this + 1;
    } while (this != local_278);
  }
  std::
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  ::~vector(local_208);
  duckdb::Connection::~Connection(local_228);
  duckdb::DuckDB::~DuckDB(local_258);
  return;
}

Assistant:

static void test_helper(string sql, duckdb::vector<string> fixtures = duckdb::vector<string>()) {
	DuckDB db;
	Connection con(db);

	for (const auto &fixture : fixtures) {
		con.SendQuery(fixture);
	}

	Parser p;
	p.ParseQuery(sql);

	for (auto &statement : p.statements) {
		con.context->transaction.BeginTransaction();
		// Should that be the default "ToString"?
		string statement_sql(statement->query.c_str() + statement->stmt_location, statement->stmt_length);
		Planner planner(*con.context);
		planner.CreatePlan(std::move(statement));
		auto plan = std::move(planner.plan);

		Optimizer optimizer(*planner.binder, *con.context);

		plan = optimizer.Optimize(std::move(plan));

		// LogicalOperator's copy utilizes its serialize and deserialize methods
		auto new_plan = plan->Copy(*con.context);

		auto optimized_plan = optimizer.Optimize(std::move(new_plan));
		con.context->transaction.Commit();
	}
}